

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StatWriter.cpp
# Opt level: O2

void __thiscall OpenMD::StatWriter::writeReal(StatWriter *this,int i)

{
  RealType RVar1;
  string local_30;
  
  RVar1 = Stats::getRealData(this->stats_,i);
  if (0x7fefffffffffffff < (ulong)ABS(RVar1)) {
    Stats::getTitle_abi_cxx11_(&local_30,this->stats_,i);
    snprintf(painCave.errMsg,2000,"StatWriter detected a numerical error writing: %s ",
             local_30._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_30);
    painCave.isFatal = 1;
    simError();
    return;
  }
  std::operator<<((ostream *)this,"\t");
  std::ostream::_M_insert<double>(RVar1);
  return;
}

Assistant:

void StatWriter::writeReal(int i) {
    RealType s = stats_->getRealData(i);

    if (!std::isinf(s) && !std::isnan(s)) {
      statfile_ << "\t" << s;
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "StatWriter detected a numerical error writing: %s ",
               stats_->getTitle(i).c_str());
      painCave.isFatal = 1;
      simError();
    }
  }